

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * Lowerer::GetLdSpreadIndicesInstr(Instr *instr)

{
  Opnd *this;
  code *pcVar1;
  bool bVar2;
  SymOpnd *pSVar3;
  StackSym *pSVar4;
  undefined4 *puVar5;
  Instr *pIVar6;
  
  this = instr->m_src2;
  bVar2 = IR::Opnd::IsSymOpnd(this);
  if (bVar2) {
    pSVar3 = IR::Opnd::AsSymOpnd(this);
    pSVar4 = Sym::AsStackSym(pSVar3->m_sym);
    pIVar6 = (pSVar4->field_5).m_instrDef;
    if ((pSVar4->field_0x18 & pIVar6 != (Instr *)0x0) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x6cb0,"(argLinkSym->IsSingleDef())","argLinkSym->IsSingleDef()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
      pIVar6 = (pSVar4->field_5).m_instrDef;
    }
  }
  else {
    pIVar6 = (Instr *)0x0;
  }
  return pIVar6;
}

Assistant:

IR::Instr* Lowerer::GetLdSpreadIndicesInstr(IR::Instr *instr)
{
    IR::Opnd *src2 = instr->GetSrc2();
    if (!src2->IsSymOpnd())
    {
        return nullptr;
    }

    IR::SymOpnd *   argLinkOpnd = src2->AsSymOpnd();
    StackSym *      argLinkSym  = argLinkOpnd->m_sym->AsStackSym();

    Assert(argLinkSym->IsSingleDef());

    return argLinkSym->m_instrDef;
}